

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perplexity.cpp
# Opt level: O3

bool __thiscall multiple_choice_answers::deserialize(multiple_choice_answers *this,istream *in)

{
  pointer pbVar1;
  bool bVar2;
  undefined8 in_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a;
  pointer str;
  uint32_t n;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  std::istream::read((char *)in,(long)&local_24);
  if (local_24 < 0x65 && ((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->answers,(ulong)local_24);
    std::vector<int,_std::allocator<int>_>::resize(&this->labels,(ulong)local_24);
    pbVar1 = (this->answers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (str = (this->answers).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; str != pbVar1; str = str + 1) {
      bVar2 = deserialize_string(in,str);
      if (!bVar2) goto LAB_001355ed;
    }
    std::istream::read((char *)in,
                       (long)(this->labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    bVar2 = ((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0;
  }
  else {
LAB_001355ed:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool deserialize(std::istream& in) {
        uint32_t n;
        in.read((char *)&n, sizeof(n));
        if (in.fail() || n > 100) return false; // 100 as max. number of answers should be good enough for any practical purpose
        answers.resize(n);
        labels.resize(n);
        for (auto& a : answers) {
            if (!deserialize_string(in, a)) return false;
        }
        in.read((char *)labels.data(), n*sizeof(int));
        return !in.fail();
    }